

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

void Gia_ManCleanTruth(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  int iVar5;
  
  if (p->vTruths == (Vec_Int_t *)0x0) {
    iVar1 = p->nObjs;
    pVVar3 = (Vec_Int_t *)malloc(0x10);
    iVar5 = 0x10;
    if (0xe < iVar1 - 1U) {
      iVar5 = iVar1;
    }
    pVVar3->nSize = 0;
    pVVar3->nCap = iVar5;
    if (iVar5 == 0) {
      piVar4 = (int *)0x0;
    }
    else {
      piVar4 = (int *)malloc((long)iVar5 << 2);
    }
    pVVar3->pArray = piVar4;
    p->vTruths = pVVar3;
  }
  pVVar3 = p->vTruths;
  uVar2 = p->nObjs;
  if (pVVar3->nCap < (int)uVar2) {
    if (pVVar3->pArray == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar2 << 2);
    }
    else {
      piVar4 = (int *)realloc(pVVar3->pArray,(long)(int)uVar2 << 2);
    }
    pVVar3->pArray = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar3->nCap = uVar2;
  }
  if (0 < (int)uVar2) {
    memset(pVVar3->pArray,0xff,(ulong)uVar2 * 4);
  }
  pVVar3->nSize = uVar2;
  return;
}

Assistant:

void Gia_ManCleanTruth( Gia_Man_t * p )
{
    if ( p->vTruths == NULL )
        p->vTruths = Vec_IntAlloc( Gia_ManObjNum(p) );
    Vec_IntFill( p->vTruths, Gia_ManObjNum(p), -1 );
}